

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::InitGoogleTest(void)

{
  char **argv;
  char *argv0;
  char *arg0;
  int argc;
  
  arg0._4_4_ = 1;
  argv0 = "dummy";
  argv = (char **)anon_var_dwarf_937c3;
  internal::InitGoogleTestImpl<char>((int *)((long)&arg0 + 4),(char **)&argv);
  return;
}

Assistant:

void InitGoogleTest() {
  // Since Arduino doesn't have a command line, fake out the argc/argv arguments
  int argc = 1;
  const auto arg0 = "dummy";
  char* argv0 = const_cast<char*>(arg0);
  char** argv = &argv0;

#if defined(GTEST_CUSTOM_INIT_GOOGLE_TEST_FUNCTION_)
  GTEST_CUSTOM_INIT_GOOGLE_TEST_FUNCTION_(&argc, argv);
#else  // defined(GTEST_CUSTOM_INIT_GOOGLE_TEST_FUNCTION_)
  internal::InitGoogleTestImpl(&argc, argv);
#endif  // defined(GTEST_CUSTOM_INIT_GOOGLE_TEST_FUNCTION_)
}